

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_DrawSpanP_C(void)

{
  byte bVar1;
  byte bVar2;
  BYTE *pBVar3;
  lighttable_t *plVar4;
  dsfixed_t dVar5;
  dsfixed_t dVar6;
  BYTE *pBVar7;
  int iVar8;
  byte bVar9;
  long lVar10;
  dsfixed_t dVar11;
  dsfixed_t dVar12;
  int iVar13;
  
  pBVar7 = ds_source;
  dVar6 = ds_ystep;
  dVar5 = ds_xstep;
  plVar4 = ds_colormap;
  pBVar3 = dc_destorg;
  iVar8 = ylookup[ds_y] + ds_x1;
  iVar13 = (ds_x2 - ds_x1) + 1;
  if (ds_ybits == 6 && ds_xbits == 6) {
    lVar10 = 0;
    dVar11 = ds_xfrac;
    dVar12 = ds_yfrac;
    do {
      pBVar3[lVar10 + iVar8] = plVar4[pBVar7[dVar12 >> 0x1a | dVar11 >> 0x14 & 0xffffffc0]];
      dVar11 = dVar11 + dVar5;
      dVar12 = dVar12 + dVar6;
      lVar10 = lVar10 + 1;
    } while (iVar13 != (int)lVar10);
  }
  else {
    bVar2 = (byte)ds_ybits;
    bVar1 = 0x20 - bVar2;
    bVar9 = (byte)ds_xbits;
    lVar10 = 0;
    dVar11 = ds_xfrac;
    dVar12 = ds_yfrac;
    do {
      pBVar3[lVar10 + iVar8] =
           plVar4[pBVar7[(int)((dVar12 >> (bVar1 & 0x1f)) +
                              (dVar11 >> (bVar1 - bVar9 & 0x1f) &
                              ~(-1 << (bVar9 & 0x1f)) << (bVar2 & 0x1f)))]];
      dVar11 = dVar11 + dVar5;
      dVar12 = dVar12 + dVar6;
      lVar10 = lVar10 + 1;
    } while (iVar13 != (int)lVar10);
  }
  return;
}

Assistant:

void R_DrawSpanP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;

#ifdef RANGECHECK 
	if (ds_x2 < ds_x1 || ds_x1 < 0
		|| ds_x2 >= screen->width || ds_y > screen->height)
	{
		I_Error ("R_DrawSpan: %i to %i at %i", ds_x1, ds_x2, ds_y);
	}
//		dscount++;
#endif

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			// Current texture index in u,v.
			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));

			// Lookup pixel from flat texture tile,
			//  re-index using light/colormap.
			*dest++ = colormap[source[spot]];

			// Next step in u,v.
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;

		do
		{
			// Current texture index in u,v.
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);

			// Lookup pixel from flat texture tile,
			//  re-index using light/colormap.
			*dest++ = colormap[source[spot]];

			// Next step in u,v.
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}